

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O0

void __thiscall YAML::BadPushback::BadPushback(BadPushback *this)

{
  string *in_RDI;
  Mark MVar1;
  Mark *mark_;
  RepresentationException *in_stack_ffffffffffffffa0;
  undefined1 local_49 [33];
  Mark local_28;
  undefined8 local_18;
  int local_10;
  
  MVar1 = Mark::null_mark();
  local_28.column = MVar1.column;
  local_10 = local_28.column;
  local_28._0_8_ = MVar1._0_8_;
  local_18._0_4_ = local_28.pos;
  local_18._4_4_ = local_28.line;
  mark_ = (Mark *)local_49;
  local_28 = MVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_49 + 1),"appending to a non-sequence",(allocator *)mark_);
  RepresentationException::RepresentationException(in_stack_ffffffffffffffa0,mark_,in_RDI);
  std::__cxx11::string::~string((string *)(local_49 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_49);
  *(undefined ***)in_RDI = &PTR__BadPushback_011399d0;
  return;
}

Assistant:

BadPushback(const BadPushback&) = default;